

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::writeSkeleton(Application *this,char *filename,Scene *scene)

{
  bool bVar1;
  reference ppSVar2;
  ostream *poVar3;
  long in_RDX;
  char *in_RSI;
  char *in_stack_00000018;
  Skeleton *in_stack_00000020;
  stringstream outfilename;
  Mesh *mesh;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  int meshID;
  string filenameNoExt;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  long local_278;
  string local_248 [32];
  stringstream local_228 [16];
  ostream local_218 [376];
  long local_a0;
  SceneObject *local_98;
  _Self local_90;
  _Self local_88;
  long local_80;
  int local_74;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  long local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::find((char *)local_38,0x30e3a1);
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
  std::__cxx11::string::operator=(local_38,local_70);
  std::__cxx11::string::~string(local_70);
  local_74 = 0;
  local_80 = local_18 + 0x98;
  local_88._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffd68);
  local_90._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffd70);
    local_98 = *ppSVar2;
    if (local_98 == (SceneObject *)0x0) {
      local_278 = 0;
    }
    else {
      local_278 = __dynamic_cast(local_98,&DynamicScene::SceneObject::typeinfo,
                                 &DynamicScene::Mesh::typeinfo,0);
    }
    local_a0 = local_278;
    if (local_278 != 0) {
      std::__cxx11::stringstream::stringstream(local_228);
      poVar3 = std::operator<<(local_218,local_38);
      poVar3 = std::operator<<(poVar3,"_");
      in_stack_fffffffffffffd70 = (ostream *)std::ostream::operator<<(poVar3,local_74);
      std::operator<<(in_stack_fffffffffffffd70,"_skel.xml");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      DynamicScene::Skeleton::save(in_stack_00000020,in_stack_00000018);
      std::__cxx11::string::~string(local_248);
      local_74 = local_74 + 1;
      std::__cxx11::stringstream::~stringstream(local_228);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffd70);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CMU462::Application::writeSkeleton(const char *filename,
                                        const DynamicScene::Scene *scene) {
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects) {
    DynamicScene::Mesh *mesh = dynamic_cast<DynamicScene::Mesh *>(object);
    if (mesh) {
      stringstream outfilename;
      outfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      mesh->skeleton->save(outfilename.str().c_str());
      meshID++;
    }
  }
}